

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeTetra>::HDivPermutation
               (int side,TPZShapeData *data,TPZVec<int> *permutegather)

{
  int iVar1;
  MElementType MVar2;
  ostream *this;
  void *this_00;
  long *plVar3;
  long in_RSI;
  int in_EDI;
  MElementType sidetype;
  int64_t nodeindex;
  int inode;
  TPZManVector<long,_4> id;
  int nsidenodes;
  int sidedimension;
  int dimension;
  size_t in_stack_00000368;
  char *in_stack_00000370;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  TPZVec<long> *in_stack_ffffffffffffff58;
  long *in_stack_ffffffffffffff60;
  MElementType eltype;
  int64_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_6c;
  TPZVec<long> local_68 [2];
  int local_24;
  int local_20;
  int local_1c;
  long local_10;
  int local_4;
  
  local_1c = 3;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_20 = pztopology::TPZTetrahedron::SideDimension(0x18ad345);
  if (local_1c != local_20 + 1) {
    this = std::operator<<((ostream *)&std::cout,"HDivPermutation called with wrong side parameter "
                          );
    this_00 = (void *)std::ostream::operator<<(this,local_4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000370,in_stack_00000368);
  }
  local_24 = pztopology::TPZTetrahedron::NSideNodes(local_4);
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  for (local_6c = 0; eltype = (MElementType)((ulong)in_stack_ffffffffffffff60 >> 0x20),
      local_6c < local_24; local_6c = local_6c + 1) {
    iVar1 = pztopology::TPZTetrahedron::SideNodeLocId
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(local_10 + 0x10),(long)iVar1);
    in_stack_ffffffffffffff58 = (TPZVec<long> *)*plVar3;
    in_stack_ffffffffffffff60 = TPZVec<long>::operator[](local_68,(long)local_6c);
    *in_stack_ffffffffffffff60 = (long)in_stack_ffffffffffffff58;
  }
  MVar2 = pztopology::TPZTetrahedron::Type(local_4);
  HDivPermutation(eltype,in_stack_ffffffffffffff58,
                  (TPZVec<int> *)CONCAT44(MVar2,in_stack_ffffffffffffff50));
  TPZManVector<long,_4>::~TPZManVector
            ((TPZManVector<long,_4> *)CONCAT44(MVar2,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::HDivPermutation(int side, TPZShapeData &data, TPZVec<int> &permutegather) {
    int dimension = TSHAPE::Dimension;
    int sidedimension = TSHAPE::SideDimension(side);

    if(dimension != sidedimension+1)
    {
        std::cout << "HDivPermutation called with wrong side parameter " << side << std::endl;
        DebugStop();
    }
    

    const int nsidenodes = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,4> id(nsidenodes);
    for(int inode=0; inode<nsidenodes; inode++)
    {

        int64_t nodeindex = TSHAPE::SideNodeLocId(side, inode);
//        id[inode] = NodePtr(nodeindex)->Id();
        id[inode] = data.fCornerNodeIds[nodeindex];
    }
    
    MElementType sidetype = TSHAPE::Type(side);
    HDivPermutation(sidetype, id, permutegather);

}